

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp.c
# Opt level: O2

c_int osqp_update_lower_bound(OSQPWorkspace *work,c_float *l_new)

{
  double *pdVar1;
  double *pdVar2;
  c_float *b;
  OSQPData *pOVar3;
  c_int cVar4;
  long lVar5;
  c_float cVar6;
  
  if (work == (OSQPWorkspace *)0x0) {
    cVar4 = _osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR,"osqp_update_lower_bound");
    return cVar4;
  }
  if (work->clear_update_time == 1) {
    work->clear_update_time = 0;
    work->info->update_time = 0.0;
  }
  osqp_tic(work->timer);
  prea_vec_copy(l_new,work->data->l,work->data->m);
  if (work->settings->scaling != 0) {
    b = work->data->l;
    vec_ew_prod(work->scaling->E,b,b,work->data->m);
  }
  pOVar3 = work->data;
  lVar5 = 0;
  do {
    if (pOVar3->m <= lVar5) {
      reset_info(work->info);
      cVar4 = update_rho_vec(work);
      cVar6 = osqp_toc(work->timer);
      work->info->update_time = cVar6 + work->info->update_time;
      return cVar4;
    }
    pdVar1 = pOVar3->l + lVar5;
    pdVar2 = pOVar3->u + lVar5;
    lVar5 = lVar5 + 1;
  } while (*pdVar1 < *pdVar2 || *pdVar1 == *pdVar2);
  printf("ERROR in %s: ","osqp_update_lower_bound");
  printf("upper bound must be greater than or equal to lower bound");
  putchar(10);
  return 1;
}

Assistant:

c_int osqp_update_lower_bound(OSQPWorkspace *work, const c_float *l_new) {
  c_int i, exitflag = 0;

  // Check if workspace has been initialized
  if (!work) return osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR);

#ifdef PROFILING
  if (work->clear_update_time == 1) {
    work->clear_update_time = 0;
    work->info->update_time = 0.0;
  }
  osqp_tic(work->timer); // Start timer
#endif /* ifdef PROFILING */

  // Replace l by the new vector
  prea_vec_copy(l_new, work->data->l, work->data->m);

  // Scaling
  if (work->settings->scaling) {
    vec_ew_prod(work->scaling->E, work->data->l, work->data->l, work->data->m);
  }

  // Check if lower bound is smaller than upper bound
  for (i = 0; i < work->data->m; i++) {
    if (work->data->l[i] > work->data->u[i]) {
#ifdef PRINTING
      c_eprint("upper bound must be greater than or equal to lower bound");
#endif /* ifdef PRINTING */
      return 1;
    }
  }

  // Reset solver information
  reset_info(work->info);

#if EMBEDDED != 1
  // Update rho_vec and refactor if constraints type changes
  exitflag = update_rho_vec(work);
#endif // EMBEDDED ! =1

#ifdef PROFILING
  work->info->update_time += osqp_toc(work->timer);
#endif /* ifdef PROFILING */

  return exitflag;
}